

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_handle.cpp
# Opt level: O0

void __thiscall
libtorrent::torrent_handle::
async_call<void(libtorrent::aux::torrent::*)(libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>,libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>),libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>&,libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>&>
          (torrent_handle *this,offset_in_torrent_to_subr f,
          strong_typedef<int,_libtorrent::aux::file_index_tag,_void> *a,
          strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void> *a_1)

{
  bool bVar1;
  element_type *this_00;
  io_context *ctx;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *in_R8;
  undefined1 local_a0 [40];
  bitfield_flag<unsigned_int,_libtorrent::status_flags_tag,_void> local_78;
  undefined1 local_74;
  session_impl *local_70;
  session_impl *ses;
  error_code_enum local_54;
  undefined1 local_50 [8];
  shared_ptr<libtorrent::aux::torrent> t;
  strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void> *a_local_1;
  strong_typedef<int,_libtorrent::aux::file_index_tag,_void> *a_local;
  offset_in_torrent_to_subr f_local;
  torrent_handle *this_local;
  
  t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_R8;
  ::std::weak_ptr<libtorrent::aux::torrent>::lock((weak_ptr<libtorrent::aux::torrent> *)local_50);
  bVar1 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_50);
  if (!bVar1) {
    local_54 = invalid_torrent_handle;
    libtorrent::aux::throw_ex<boost::system::system_error,libtorrent::errors::error_code_enum>
              (&local_54);
  }
  this_00 = ::std::
            __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_50);
  local_70 = (session_impl *)libtorrent::aux::torrent::session(this_00);
  ctx = libtorrent::aux::session_impl::get_context(local_70);
  local_a0._0_8_ = local_70;
  ::std::shared_ptr<libtorrent::aux::torrent>::shared_ptr
            ((shared_ptr<libtorrent::aux::torrent> *)(local_a0 + 8),
             (shared_ptr<libtorrent::aux::torrent> *)local_50);
  local_78.m_val = *(uint *)a_1;
  local_74 = *(undefined1 *)
              &(t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_vptr__Sp_counted_base;
  local_a0._24_8_ = f;
  local_a0._32_8_ = a;
  boost::asio::
  dispatch<boost::asio::io_context,libtorrent::torrent_handle::async_call<void(libtorrent::aux::torrent::*)(libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>,libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>),libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>&,libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>&>(void(libtorrent::aux::torrent::*)(libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>,libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>),libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>&,libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>&)const::_lambda()_1_>
            (ctx,(type_conflict9 *)local_a0,(type *)0x0);
  const::{lambda()#1}::~async_call((_lambda___1_ *)local_a0);
  ::std::shared_ptr<libtorrent::aux::torrent>::~shared_ptr
            ((shared_ptr<libtorrent::aux::torrent> *)local_50);
  return;
}

Assistant:

void torrent_handle::async_call(Fun f, Args&&... a) const
	{
		auto t = m_torrent.lock();
		if (!t) aux::throw_ex<system_error>(errors::invalid_torrent_handle);
		auto& ses = static_cast<session_impl&>(t->session());
		dispatch(ses.get_context(), [=,&ses] ()
		{
#ifndef BOOST_NO_EXCEPTIONS
			try {
#endif
				(t.get()->*f)(std::move(a)...);
#ifndef BOOST_NO_EXCEPTIONS
			} catch (system_error const& e) {
				ses.alerts().emplace_alert<torrent_error_alert>(torrent_handle(t)
					, e.code(), e.what());
			} catch (std::exception const& e) {
				ses.alerts().emplace_alert<torrent_error_alert>(torrent_handle(t)
					, error_code(), e.what());
			} catch (...) {
				ses.alerts().emplace_alert<torrent_error_alert>(torrent_handle(t)
					, error_code(), "unknown error");
			}
#endif
		} );
	}